

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O3

void nni_dialer_rele(nni_dialer *d)

{
  _Bool _Var1;
  int iVar2;
  
  nni_mtx_lock(&dialers_lk);
  iVar2 = d->d_ref;
  if (iVar2 < 1) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/dialer.c",
              0x16c,"d->d_ref > 0");
    iVar2 = d->d_ref;
  }
  d->d_ref = iVar2 + -1;
  if (iVar2 + -1 != 0) {
    nni_mtx_unlock(&dialers_lk);
    return;
  }
  _Var1 = d->d_closed;
  nni_mtx_unlock(&dialers_lk);
  if (_Var1 == true) {
    nni_dialer_reap(d);
    return;
  }
  return;
}

Assistant:

void
nni_dialer_rele(nni_dialer *d)
{
	bool reap;

	nni_mtx_lock(&dialers_lk);
	NNI_ASSERT(d->d_ref > 0);
	d->d_ref--;
	reap = ((d->d_ref == 0) && (d->d_closed));
	nni_mtx_unlock(&dialers_lk);

	if (reap) {
		nni_dialer_reap(d);
	}
}